

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O0

void __thiscall mocker::Annotator::operator()(Annotator *this,FuncDecl *node)

{
  bool bVar1;
  vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
  *this_00;
  element_type *peVar2;
  shared_ptr<mocker::ast::Type> local_f0;
  ScopeID local_e0;
  shared_ptr<mocker::ast::ASTNode> local_c8;
  reference local_b8;
  shared_ptr<mocker::ast::Statement> *stmt;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
  *__range2_1;
  shared_ptr<mocker::ast::ASTNode> local_80;
  reference local_70;
  shared_ptr<mocker::ast::VarDeclStmt> *param;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
  *__range2;
  ScopeID scopeIntroduced;
  shared_ptr<mocker::ast::ASTNode> local_28;
  FuncDecl *local_18;
  FuncDecl *node_local;
  Annotator *this_local;
  
  local_18 = node;
  node_local = (FuncDecl *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&node->retType);
  if (bVar1) {
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Type,void>
              (&local_28,&local_18->retType);
    visit(this,&local_28);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_28);
  }
  SymTbl::createSubscope((ScopeID *)&__range2,&this->ctx->syms,&this->scopeResiding);
  this_00 = &local_18->formalParameters;
  __end2 = std::
           vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
           ::begin(this_00);
  param = (shared_ptr<mocker::ast::VarDeclStmt> *)
          std::
          vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
          ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<mocker::ast::VarDeclStmt>_*,_std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>_>
                                     *)&param), bVar1) {
    local_70 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<mocker::ast::VarDeclStmt>_*,_std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>_>
               ::operator*(&__end2);
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::VarDeclStmt,void>
              (&local_80,local_70);
    ScopeID::ScopeID((ScopeID *)&__range2_1,(ScopeID *)&__range2);
    visit(this,&local_80,(ScopeID *)&__range2_1);
    ScopeID::~ScopeID((ScopeID *)&__range2_1);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_80);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::ast::VarDeclStmt>_*,_std::vector<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>_>
    ::operator++(&__end2);
  }
  peVar2 = std::
           __shared_ptr_access<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&local_18->body);
  __end2_1 = std::
             vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
             ::begin(&peVar2->stmts);
  stmt = (shared_ptr<mocker::ast::Statement> *)
         std::
         vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
         ::end(&peVar2->stmts);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::shared_ptr<mocker::ast::Statement>_*,_std::vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>_>
                             *)&stmt), bVar1) {
    local_b8 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<mocker::ast::Statement>_*,_std::vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>_>
               ::operator*(&__end2_1);
    std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Statement,void>
              (&local_c8,local_b8);
    ScopeID::ScopeID(&local_e0,(ScopeID *)&__range2);
    std::shared_ptr<mocker::ast::Type>::shared_ptr(&local_f0,&local_18->retType);
    visit(this,&local_c8,&local_e0,false,true,&local_f0);
    std::shared_ptr<mocker::ast::Type>::~shared_ptr(&local_f0);
    ScopeID::~ScopeID(&local_e0);
    std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_c8);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<mocker::ast::Statement>_*,_std::vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>_>
    ::operator++(&__end2_1);
  }
  ScopeID::~ScopeID((ScopeID *)&__range2);
  return;
}

Assistant:

void operator()(ast::FuncDecl &node) const override {
    if (node.retType)
      visit(node.retType);

    auto scopeIntroduced = ctx.syms.createSubscope(scopeResiding);

    for (const auto &param : node.formalParameters)
      visit(param, scopeIntroduced);

    for (auto &stmt : node.body->stmts)
      visit(stmt, scopeIntroduced, false, true, node.retType);
  }